

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.cpp
# Opt level: O2

vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *
handlegraph::algorithms::topological_order
          (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
           *__return_storage_ptr__,HandleGraph *g)

{
  _Base_ptr p_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar3;
  undefined4 extraout_var_01;
  size_type sVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t sVar5;
  handle_t *head;
  pointer phVar6;
  HandleGraph *g_local;
  _Function_base *local_170;
  undefined1 *local_168;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  *local_160;
  unordered_set<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>_>
  *local_158;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *local_150;
  handle_t first_seed;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  unvisited;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  s;
  handle_t n;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> heads;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  seeds;
  unordered_set<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>_>
  masked_edges;
  
  (__return_storage_ptr__->
  super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  g_local = g;
  iVar2 = (*g->_vptr_HandleGraph[9])(g);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::reserve
            (__return_storage_ptr__,CONCAT44(extraout_var,iVar2));
  masked_edges._M_h._M_buckets = &masked_edges._M_h._M_single_bucket;
  masked_edges._M_h._M_bucket_count = 1;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &s._M_t._M_impl.super__Rb_tree_header._M_header;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  masked_edges._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  masked_edges._M_h._M_element_count = 0;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  masked_edges._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  masked_edges._M_h._M_rehash_policy._M_next_resize = 0;
  masked_edges._M_h._M_single_bucket = (__node_base_ptr)0x0;
  s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  head_nodes((HandleGraph *)0x16d89b);
  seeds._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &seeds._M_t._M_impl.super__Rb_tree_header._M_header;
  seeds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  seeds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  seeds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  seeds._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       seeds._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (phVar6 = heads.
                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      phVar6 != heads.
                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
                _M_impl.super__Vector_impl_data._M_finish; phVar6 = phVar6 + 1) {
    unvisited._M_t._M_impl._0_4_ = (*g_local->_vptr_HandleGraph[4])(g_local,phVar6);
    unvisited._M_t._M_impl._4_4_ = extraout_var_00;
    pmVar3 = std::
             map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
             ::operator[](&s,(key_type *)&unvisited);
    *(undefined8 *)pmVar3->data = *(undefined8 *)phVar6->data;
  }
  unvisited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &unvisited._M_t._M_impl.super__Rb_tree_header._M_header;
  unvisited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unvisited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  unvisited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  first_seed.data = (char  [8])&local_170;
  local_170 = (_Function_base *)&s;
  local_160 = &unvisited;
  local_168 = (undefined1 *)&g_local;
  local_150 = __return_storage_ptr__;
  unvisited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       unvisited._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (*g_local->_vptr_HandleGraph[0x13])(g_local,(_Function_base *)&first_seed,0);
  std::_Function_base::~_Function_base((_Function_base *)&first_seed);
  sVar5 = s._M_t._M_impl.super__Rb_tree_header._M_node_count;
  do {
    if (unvisited._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 && sVar5 == 0) {
      std::
      _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
      ::~_Rb_tree(&unvisited._M_t);
      std::
      _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
      ::~_Rb_tree(&seeds._M_t);
      std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::
      ~_Vector_base(&heads.
                     super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                   );
      std::
      _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
      ::~_Rb_tree(&s._M_t);
      std::
      _Hashtable<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Identity,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&masked_edges._M_h);
      return local_150;
    }
    while (p_Var1 = unvisited._M_t._M_impl.super__Rb_tree_header._M_header._M_left, sVar5 == 0) {
      if (seeds._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        pmVar3 = std::
                 map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                 ::operator[](&s,(key_type *)
                                 (unvisited._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1
                                 ));
        *(_Base_ptr *)pmVar3->data = p_Var1[1]._M_parent;
        std::
        _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
        ::erase(&unvisited._M_t,
                (key_type *)(unvisited._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
        break;
      }
      first_seed.data =
           (char  [8])seeds._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      iVar2 = (*g_local->_vptr_HandleGraph[4])(g_local,(_Function_base *)&first_seed);
      local_170 = (_Function_base *)CONCAT44(extraout_var_01,iVar2);
      sVar4 = std::
              map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
              ::count((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                       *)&unvisited._M_t,(key_type *)&local_170);
      if (sVar4 != 0) {
        iVar2 = (*g_local->_vptr_HandleGraph[4])(g_local,(_Function_base *)&first_seed);
        local_170 = (_Function_base *)CONCAT44(extraout_var_02,iVar2);
        pmVar3 = std::
                 map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                 ::operator[](&s,(key_type *)&local_170);
        *&pmVar3->data = first_seed.data;
        iVar2 = (*g_local->_vptr_HandleGraph[4])(g_local,(_Function_base *)&first_seed);
        local_170 = (_Function_base *)CONCAT44(extraout_var_03,iVar2);
        std::
        _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
        ::erase(&unvisited._M_t,(key_type *)&local_170);
      }
      std::
      _Rb_tree<long_long,std::pair<long_long_const,handlegraph::handle_t>,std::_Select1st<std::pair<long_long_const,handlegraph::handle_t>>,std::less<long_long>,std::allocator<std::pair<long_long_const,handlegraph::handle_t>>>
      ::erase_abi_cxx11_((_Rb_tree<long_long,std::pair<long_long_const,handlegraph::handle_t>,std::_Select1st<std::pair<long_long_const,handlegraph::handle_t>>,std::less<long_long>,std::allocator<std::pair<long_long_const,handlegraph::handle_t>>>
                          *)&seeds,
                         (iterator)seeds._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
      sVar5 = s._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    while (s._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      n.data = (char  [8])s._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      first_seed.data._0_4_ = (*g_local->_vptr_HandleGraph[4])(g_local,&n);
      first_seed.data[4] = (char)extraout_var_04;
      first_seed.data[5] = (char)((uint)extraout_var_04 >> 8);
      first_seed.data[6] = (char)((uint)extraout_var_04 >> 0x10);
      first_seed.data[7] = (char)((uint)extraout_var_04 >> 0x18);
      std::
      _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
      ::erase(&s._M_t,(key_type *)&first_seed);
      std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::push_back
                (local_150,&n);
      local_170 = (_Function_base *)&unvisited;
      local_168 = (undefined1 *)&g_local;
      local_160 = (map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                   *)&n;
      local_158 = &masked_edges;
      first_seed.data = (char  [8])&local_170;
      (*g_local->_vptr_HandleGraph[0x12])(g_local,&n,1,(_Function_base *)&first_seed);
      std::_Function_base::~_Function_base((_Function_base *)&first_seed);
      local_168 = (undefined1 *)0x0;
      local_158 = (unordered_set<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>_>
                   *)std::
                     _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                     ::_M_invoke;
      local_160 = (map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                   *)std::
                     _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                     ::_M_manager;
      local_170 = (_Function_base *)&first_seed;
      first_seed.data = (char  [8])&g_local;
      (*g_local->_vptr_HandleGraph[0x12])(g_local,&n,0,&local_170);
      std::_Function_base::~_Function_base((_Function_base *)&local_170);
    }
    sVar5 = 0;
  } while( true );
}

Assistant:

vector<handle_t> topological_order(const HandleGraph* g) {
    
    // Make a vector to hold the ordered and oriented nodes.
    vector<handle_t> sorted;
    sorted.reserve(g->get_node_count());
    
    // Instead of actually removing edges, we add them to this set of masked edges.
    unordered_set<pair<handle_t, handle_t>> masked_edges;
    
    // This (s) is our set of oriented nodes.
    // using a map instead of a set ensures a stable sort across different systems
    map<nid_t, handle_t> s;

    // We find the head and tails, if there are any
    vector<handle_t> heads{head_nodes(g)};
    // No need to fetch the tails since we don't use them

    
    // Maps from node ID to first orientation we suggested for it.
    map<nid_t, handle_t> seeds;
    
    
    for(handle_t& head : heads) {
        // Dump all the heads into the oriented set, rather than having them as
        // seeds. We will only go for cycle-breaking seeds when we run out of
        // heads. This is bad for contiguity/ordering consistency in cyclic
        // graphs and reversing graphs, but makes sure we work out to just
        // topological sort on DAGs. It mimics the effect we used to get when we
        // joined all the head nodes to a new root head node and seeded that. We
        // ignore tails since we only orient right from nodes we pick.
        s[g->get_id(head)] = head;
    }

    // We will use an ordered map handles by ID for nodes we have not visited
    // yet. This ensures a consistent sort order across systems.
    map<nid_t, handle_t> unvisited;
    g->for_each_handle([&](const handle_t& found) {
        if (!s.count(g->get_id(found))) {
            // Only nodes that aren't yet in s are unvisited.
            // Nodes in s are visited but just need to be added tot he ordering.
            unvisited.emplace(g->get_id(found), found);
        }
    });

    while(!unvisited.empty() || !s.empty()) {

        // Put something in s. First go through seeds until we can find one
        // that's not already oriented.
        while(s.empty() && !seeds.empty()) {
            // Look at the first seed
            auto first_seed = (*seeds.begin()).second;

            if(unvisited.count(g->get_id(first_seed))) {
                // We have an unvisited seed. Use it
#ifdef debug
                cerr << "Starting from seed " << g->get_id(first_seed) << " orientation " << g->get_is_reverse(first_seed) << endl;
#endif

                s[g->get_id(first_seed)] = first_seed;
                unvisited.erase(g->get_id(first_seed));
            }
            // Whether we used the seed or not, don't keep it around
            seeds.erase(seeds.begin());
        }

        if(s.empty()) {
            // If we couldn't find a seed, just grab any old node.
            // Since map order is stable across systems, we can take the first node by id and put it locally forward.
#ifdef debug
            cerr << "Starting from arbitrary node " << unvisited.begin()->first << " locally forward" << endl;
#endif

            s[unvisited.begin()->first] = unvisited.begin()->second;
            unvisited.erase(unvisited.begin()->first);
        }

        while (!s.empty()) {
            // Grab an oriented node
            auto n = s.begin()->second;
            s.erase(g->get_id(n));
            // Emit it
            sorted.push_back(n);
#ifdef debug
            cerr << "Using oriented node " << g->get_id(n) << " orientation " << g->get_is_reverse(n) << endl;
#endif

            // See if it has an edge from its start to the start of some node
            // where both were picked as places to break into cycles. A
            // reversing self loop on a cycle entry point is a special case of
            // this.
            g->follow_edges(n, true, [&](const handle_t& prev_node) {
                if(!unvisited.count(g->get_id(prev_node))) {
                    // Look at the edge
                    auto edge = g->edge_handle(prev_node, n);
                    if (masked_edges.count(edge)) {
                        // We removed this edge, so skip it.
                        return;
                    }
                    
#ifdef debug
                    cerr << "\tHas left-side edge to cycle entry point " << g->get_id(prev_node)
                         << " orientation " << g->get_is_reverse(prev_node) << endl;
#endif

                    // Mask the edge
                    masked_edges.insert(edge);
                    
#ifdef debug
                    cerr << "\t\tEdge: " << g->get_id(edge.first) << " " << g->get_is_reverse(edge.first)
                        << " -> " << g->get_id(edge.second) << " " << g->get_is_reverse(edge.second) << endl;
#endif
                }
            });

            // All other connections and self loops are handled by looking off the right side.

            // See what all comes next, minus deleted edges.
            g->follow_edges(n, false, [&](const handle_t& next_node) {

                // Look at the edge
                auto edge = g->edge_handle(n, next_node);
                if (masked_edges.count(edge)) {
                    // We removed this edge, so skip it.
                    return;
                }

#ifdef debug
                cerr << "\tHas edge to " << g->get_id(next_node) << " orientation " << g->get_is_reverse(next_node) << endl;
#endif

                // Mask the edge connecting these nodes in this order and
                // relative orientation, so we can't traverse it again

#ifdef debug
                cerr << "\t\tEdge: " << g->get_id(edge.first) << " " << g->get_is_reverse(edge.first)
                    << " -> " << g->get_id(edge.second) << " " << g->get_is_reverse(edge.second) << endl;
#endif

                // Mask the edge
                masked_edges.insert(edge);

                if(unvisited.count(g->get_id(next_node))) {
                    // We haven't already started here as an arbitrary cycle entry point

#ifdef debug
                    cerr << "\t\tAnd node hasn't been visited yet" << endl;
#endif

                    bool unmasked_incoming_edge = false;
                    g->follow_edges(next_node, true, [&](const handle_t& prev_node) {
                        // Get a handle for each incoming edge
                        auto prev_edge = g->edge_handle(prev_node, next_node);
                        
                        if (!masked_edges.count(prev_edge)) {
                            // We found such an edghe and can stop looking
                            unmasked_incoming_edge = true;
                            return false;
                        }
                        // Otherwise check all the edges on the left of this handle
                        return true;
                    });

                    if(!unmasked_incoming_edge) {

#ifdef debug
                        cerr << "\t\t\tIs last incoming edge" << endl;
#endif
                        // Keep this orientation and put it here
                        s[g->get_id(next_node)] = next_node;
                        // Remember that we've visited and oriented this node, so we
                        // don't need to use it as a seed.
                        unvisited.erase(g->get_id(next_node));

                    } else if(!seeds.count(g->get_id(next_node))) {
                        // We came to this node in this orientation; when we need a
                        // new node and orientation to start from (i.e. an entry
                        // point to the node's cycle), we might as well pick this
                        // one.
                        // Only take it if we don't already know of an orientation for this node.
                        seeds[g->get_id(next_node)] = next_node;

#ifdef debug
                        cerr << "\t\t\tSuggests seed " << g->get_id(next_node) << " orientation " << g->get_is_reverse(next_node) << endl;
#endif
                    }
                } else {
#ifdef debug
                    cerr << "\t\tAnd node was already visited (to break a cycle)" << endl;
#endif
                }
            });
        }
    }

    // Send away our sorted ordering.
    return sorted;
}